

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O1

int heap_add_entry(archive_read *a,heap_queue *heap,file_info *file,uint64_t key)

{
  int iVar1;
  file_info **ppfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  
  uVar7 = heap->used;
  iVar1 = heap->allocated;
  if ((int)uVar7 < iVar1) {
LAB_00138ad9:
    uVar3 = (ulong)(uVar7 & 0xffff) | key << 0x10;
    file->key = uVar3;
    uVar7 = heap->used;
    heap->used = uVar7 + 1;
    uVar4 = (ulong)uVar7;
    if (0 < (int)uVar7) {
      do {
        uVar7 = (int)uVar4 - 1;
        uVar5 = (ulong)(uVar7 >> 1);
        ppfVar2 = heap->files;
        if (ppfVar2[uVar5]->key <= uVar3) {
          ppfVar2[uVar4] = file;
          goto LAB_00138b41;
        }
        ppfVar2[uVar4] = ppfVar2[uVar5];
        uVar4 = uVar5;
      } while (1 < uVar7);
    }
    *heap->files = file;
LAB_00138b41:
    iVar1 = 0;
  }
  else {
    iVar6 = iVar1 * 2;
    if (iVar1 < 0x400) {
      iVar6 = 0x400;
    }
    if (iVar1 < iVar6) {
      ppfVar2 = (file_info **)calloc((long)iVar6,8);
      if (ppfVar2 != (file_info **)0x0) {
        if (iVar1 != 0) {
          memcpy(ppfVar2,heap->files,(long)iVar1 << 3);
        }
        free(heap->files);
        heap->files = ppfVar2;
        heap->allocated = iVar6;
        goto LAB_00138ad9;
      }
    }
    archive_set_error(&a->archive,0xc,"Out of memory");
    iVar1 = -0x1e;
  }
  return iVar1;
}

Assistant:

static int
heap_add_entry(struct archive_read *a, struct heap_queue *heap,
    struct file_info *file, uint64_t key)
{
	uint64_t file_key, parent_key;
	int hole, parent;

	/* Reserve 16 bits for possible key collisions (needed for linked items) */
	/* For ISO files with more than 65535 entries, reordering will still occur */
	key <<= 16;
	key += heap->used & 0xFFFF;

	/* Expand our pending files list as necessary. */
	if (heap->used >= heap->allocated) {
		struct file_info **new_pending_files;
		int new_size = heap->allocated * 2;

		if (heap->allocated < 1024)
			new_size = 1024;
		/* Overflow might keep us from growing the list. */
		if (new_size <= heap->allocated) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		new_pending_files = (struct file_info **)
		    calloc(new_size, sizeof(new_pending_files[0]));
		if (new_pending_files == NULL) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		if (heap->allocated)
			memcpy(new_pending_files, heap->files,
			    heap->allocated * sizeof(new_pending_files[0]));
		free(heap->files);
		heap->files = new_pending_files;
		heap->allocated = new_size;
	}

	file_key = file->key = key;

	/*
	 * Start with hole at end, walk it up tree to find insertion point.
	 */
	hole = heap->used++;
	while (hole > 0) {
		parent = (hole - 1)/2;
		parent_key = heap->files[parent]->key;
		if (file_key >= parent_key) {
			heap->files[hole] = file;
			return (ARCHIVE_OK);
		}
		/* Move parent into hole <==> move hole up tree. */
		heap->files[hole] = heap->files[parent];
		hole = parent;
	}
	heap->files[0] = file;

	return (ARCHIVE_OK);
}